

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2cell_id_vector.cc
# Opt level: O3

vector<S2CellId,_std::allocator<S2CellId>_> * __thiscall
s2coding::EncodedS2CellIdVector::Decode
          (vector<S2CellId,_std::allocator<S2CellId>_> *__return_storage_ptr__,
          EncodedS2CellIdVector *this)

{
  unsigned_long_long uVar1;
  ulong uVar2;
  allocator_type local_19;
  
  std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
            (__return_storage_ptr__,(ulong)(this->deltas_).size_,&local_19);
  if ((this->deltas_).size_ != 0) {
    uVar2 = 0;
    do {
      uVar1 = EncodedUintVector<unsigned_long_long>::operator[](&this->deltas_,(int)uVar2);
      (__return_storage_ptr__->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar2].id_ = (uVar1 << (this->shift_ & 0x3f)) + this->base_;
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->deltas_).size_);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<S2CellId> EncodedS2CellIdVector::Decode() const {
  vector<S2CellId> result(size());
  for (int i = 0; i < size(); ++i) {
    result[i] = (*this)[i];
  }
  return result;
}